

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse2.c
# Opt level: O2

void aom_dc_predictor_64x16_sse2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  int iVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined4 extraout_XMM0_Da;
  undefined1 auVar4 [16];
  __m128i row;
  
  dc_sum_64(above);
  auVar4 = psadbw((undefined1  [16])0x0,*(undefined1 (*) [16])left);
  iVar1 = (CONCAT22(auVar4._2_2_ + (short)((uint)extraout_XMM0_Da >> 0x10) + auVar4._10_2_,
                    auVar4._0_2_ + (short)extraout_XMM0_Da + auVar4._8_2_) + 0x28U >> 4) * 0x3334;
  uVar3 = (undefined1)((uint)iVar1 >> 0x18);
  uVar2 = (undefined1)((uint)iVar1 >> 0x10);
  auVar4 = ZEXT416(CONCAT22(CONCAT11(uVar3,uVar3),CONCAT11(uVar2,uVar2)));
  auVar4 = pshuflw(auVar4,auVar4,0);
  row[0]._0_4_ = auVar4._0_4_;
  row[0]._4_4_ = (undefined4)row[0];
  row[1]._0_4_ = (undefined4)row[0];
  row[1]._4_4_ = (undefined4)row[0];
  dc_store_64xh(&row,0x10,dst,stride);
  return;
}

Assistant:

void aom_dc_predictor_64x16_sse2(uint8_t *dst, ptrdiff_t stride,
                                 const uint8_t *above, const uint8_t *left) {
  __m128i sum_above = dc_sum_64(above);
  const __m128i sum_left = dc_sum_16_sse2(left);
  sum_above = _mm_add_epi16(sum_above, sum_left);

  uint32_t sum = (uint32_t)_mm_cvtsi128_si32(sum_above);
  sum += 40;
  sum = divide_using_multiply_shift(sum, 4, DC_MULTIPLIER_1X4);
  const __m128i row = _mm_set1_epi8((int8_t)sum);
  dc_store_64xh(&row, 16, dst, stride);
}